

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
 __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator
          (ValueArray<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
           *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  ParamGenerator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
  PVar1;
  vector<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
  *in_stack_ffffffffffffffc0;
  vector<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
  *in_stack_ffffffffffffffc8;
  ValueArray<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
  local_28 [2];
  
  ValueArray<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>>
  ::
  MakeVector<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>,0ul>
            (local_28,in_RSI);
  ValuesIn<std::vector<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>,std::allocator<std::tuple<void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int),void(*)(unsigned_short*,int,unsigned_char_const*,int,int,int)>>>>
            (in_stack_ffffffffffffffc8);
  std::
  vector<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>,_std::allocator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>_>
  ::~vector(in_stack_ffffffffffffffc0);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int),_void_(*)(unsigned_short_*,_int,_const_unsigned_char_*,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }